

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void ParseXMLElement(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  Node *pNVar2;
  Bool BVar3;
  int iVar4;
  uint uVar5;
  Node *pNVar6;
  Node **ppNVar7;
  GetTokenMode mode_00;
  
  pLVar1 = doc->lexer;
  BVar3 = prvTidyXMLPreserveWhiteSpace(doc,element);
  mode_00 = Preformatted;
  if (BVar3 == no) {
    mode_00 = mode;
  }
  pNVar6 = prvTidyGetToken(doc,mode_00);
  if (pNVar6 != (Node *)0x0) {
    do {
      if (((pNVar6->type == EndTag) && (pNVar6->element != (ctmbstr)0x0)) &&
         (element->element != (ctmbstr)0x0)) {
        iVar4 = prvTidytmbstrcmp(pNVar6->element,element->element);
        if (iVar4 == 0) {
          prvTidyFreeNode(doc,pNVar6);
          element->closed = yes;
          break;
        }
      }
      if (pNVar6->type == StartTag) {
        ParseXMLElement(doc,pNVar6,mode_00);
LAB_00143e5d:
        pNVar6->parent = element;
        pNVar2 = element->last;
        pNVar6->prev = pNVar2;
        ppNVar7 = &pNVar2->next;
        if (pNVar2 == (Node *)0x0) {
          ppNVar7 = &element->content;
        }
        *ppNVar7 = pNVar6;
        element->last = pNVar6;
      }
      else {
        if (pNVar6->type != EndTag) goto LAB_00143e5d;
        prvTidyReport(doc,element,pNVar6,0x286);
        prvTidyFreeNode(doc,pNVar6);
      }
      pNVar6 = prvTidyGetToken(doc,mode_00);
    } while (pNVar6 != (Node *)0x0);
  }
  pNVar6 = element->content;
  BVar3 = prvTidynodeIsText(pNVar6);
  if (((mode_00 != Preformatted) && (BVar3 != no)) &&
     ((pLVar1->lexbuf[pNVar6->start] == ' ' &&
      (uVar5 = pNVar6->start + 1, pNVar6->start = uVar5, pNVar6->end <= uVar5)))) {
    prvTidyDiscardElement(doc,pNVar6);
  }
  pNVar6 = element->last;
  BVar3 = prvTidynodeIsText(pNVar6);
  if (((mode_00 != Preformatted) && (BVar3 != no)) &&
     ((uVar5 = pNVar6->end - 1, pLVar1->lexbuf[uVar5] == ' ' &&
      (pNVar6->end = uVar5, uVar5 <= pNVar6->start)))) {
    prvTidyDiscardElement(doc,pNVar6);
    return;
  }
  return;
}

Assistant:

static void ParseXMLElement(TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    /* if node is pre or has xml:space="preserve" then do so */

    if ( TY_(XMLPreserveWhiteSpace)(doc, element) )
        mode = Preformatted;

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->type == EndTag &&
           node->element && element->element &&
           TY_(tmbstrcmp)(node->element, element->element) == 0)
        {
            TY_(FreeNode)( doc, node);
            element->closed = yes;
            break;
        }

        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            if (element)
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_IN);
            else
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_ERR);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* parse content on seeing start tag */
        if (node->type == StartTag)
            ParseXMLElement( doc, node, mode );

        TY_(InsertNodeAtEnd)(element, node);
    }

    /*
     if first child is text then trim initial space and
     delete text node if it is empty.
    */

    node = element->content;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->start] == ' ' )
        {
            node->start++;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }

    /*
     if last child is text then trim final space and
     delete the text node if it is empty
    */

    node = element->last;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->end - 1] == ' ' )
        {
            node->end--;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }
}